

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.cxx
# Opt level: O1

int main(void)

{
  bool bVar1;
  OledPoint offset;
  int byte;
  int iVar2;
  int block;
  uint uVar3;
  long lVar4;
  int iVar5;
  OledBitmap<16,_16> bitmap;
  OledI2C oled;
  string local_4e8;
  OledPixel local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  OledI2C local_4a0;
  
  local_4c8._vptr_OledPixel = (_func_int **)&PTR__OledPixel_00109a90;
  local_4c0 = 0;
  uStack_4b8 = 0;
  local_4b0 = 0;
  uStack_4a8 = 0;
  uVar3 = 0;
  lVar4 = 0;
  iVar2 = 0;
  do {
    *(undefined1 *)((long)&local_4c0 + (long)iVar2 + (ulong)uVar3 * 2) = (&DAT_00107004)[lVar4];
    iVar5 = iVar2 + 1;
    if (0 < iVar2) {
      iVar5 = 0;
    }
    uVar3 = uVar3 + (0 < iVar2);
    lVar4 = lVar4 + 4;
    iVar2 = iVar5;
  } while (lVar4 != 0x80);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"/dev/i2c-1","");
  SSD1306::OledI2C::OledI2C(&local_4a0,&local_4e8,'<');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = -8;
  do {
    iVar5 = -0x18;
    do {
      iVar5 = iVar5 + 0x10;
      offset.m_y = iVar2;
      offset.m_x = iVar5;
      SSD1306::OledPixel::setFrom(&local_4a0.super_OledPixel,&local_4c8,offset);
    } while (iVar5 < 0x78);
    bVar1 = iVar2 < 0x38;
    iVar2 = iVar2 + 0x10;
  } while (bVar1);
  SSD1306::OledI2C::displayUpdate(&local_4a0);
  SSD1306::OledI2C::~OledI2C(&local_4a0);
  SSD1306::OledPixel::~OledPixel(&local_4c8);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledBitmap<16, 16> bitmap
        {
             0b00001010, 0b10100000,
             0b00001111, 0b11000000,
             0b00111111, 0b11101000,
             0b00111111, 0b01010000,
             0b01111111, 0b11101010,
             0b01111111, 0b11010100,
             0b11111111, 0b10101010,
             0b01110111, 0b01010000,
             0b11111111, 0b11101010,
             0b01010101, 0b01000000,
             0b00111010, 0b10100010,
             0b00010101, 0b00000000,
             0b00101010, 0b10101000,
             0b00000100, 0b00000000,
             0b00000010, 0b00100000,
             0b00000000, 0b00000000
        };

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        for (auto y = -(bitmap.height() / 2) ;
             y < (oled.height() + (bitmap.height() / 2)) ;
             y += bitmap.height())
        {
            for (auto x = -(bitmap.width() / 2) ;
                 x < (oled.width() + (bitmap.width() / 2)) ;
                 x += bitmap.width())
            {
                oled.setFrom(bitmap, SSD1306::OledPoint{x, y});
            }
        }

        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}